

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *this;
  string local_78;
  string local_58;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)printer;
  io::Printer::Print(printer,"/**\n");
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,local_18);
  this = field_local;
  FieldDescriptor::DebugString_abi_cxx11_(&local_78,local_18);
  FirstLineOf(&local_58,&local_78);
  EscapePhpdoc(&local_38,&local_58);
  io::Printer::Print((Printer *)this," * <code>^def^</code>\n","def",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  io::Printer::Print((Printer *)field_local," */\n");
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer,
                             const FieldDescriptor* field) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" */\n");
}